

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O2

Aig_Man_t * Aig_ManDupPartAll(Aig_Man_t *pOld,Vec_Int_t *vPart)

{
  Aig_Obj_t *pAVar1;
  int i;
  Aig_Man_t *pNew;
  Aig_Obj_t *pAVar2;
  int i_00;
  
  Aig_ManIncrementTravId(pOld);
  pNew = Aig_ManStart(5000);
  pAVar2 = pOld->pConst1;
  pAVar1 = pNew->pConst1;
  (pAVar2->field_5).pData = pAVar1;
  (pAVar1->field_5).pData = pAVar2;
  pAVar2->TravId = pOld->nTravIds;
  for (i_00 = 0; i_00 < vPart->nSize; i_00 = i_00 + 1) {
    i = Vec_IntEntry(vPart,i_00);
    pAVar2 = Aig_ManCo(pOld,i);
    Aig_ManDupPartAll_rec(pNew,pOld,pAVar2);
  }
  return pNew;
}

Assistant:

Aig_Man_t * Aig_ManDupPartAll( Aig_Man_t * pOld, Vec_Int_t * vPart )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew;
    int i, Entry;
    Aig_ManIncrementTravId( pOld );
    pNew = Aig_ManStart( 5000 );
    // map constant nodes
    pObj = Aig_ManConst1(pOld);
    pObjNew = Aig_ManConst1(pNew);
    pObj->pData = pObjNew;
    pObjNew->pData = pObj;
    Aig_ObjSetTravIdCurrent(pOld, pObj);
    // map all other nodes
    Vec_IntForEachEntry( vPart, Entry, i )
    {
        pObj = Aig_ManCo( pOld, Entry );
        Aig_ManDupPartAll_rec( pNew, pOld, pObj );
    }
    return pNew;
}